

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O0

string * __thiscall
Downloader::get_compiler_abi_cxx11_
          (string *__return_storage_ptr__,Downloader *this,bool allow_default)

{
  bool bVar1;
  ostream *poVar2;
  CCDir local_128;
  undefined1 local_43;
  uchar local_42;
  uchar local_41;
  reference local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *e;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  bool allow_default_local;
  Downloader *this_local;
  string *compiler_name;
  
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&args.options);
  e = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&args.options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&e), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
    bVar1 = std::operator==(&local_40->first,"-c");
    if ((bVar1) || (bVar1 = std::operator==(&local_40->first,"--compiler"), bVar1)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_40->second);
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  if (!allow_default) {
    local_41 = ispring::xout[0x3c];
    poVar2 = operator<<((ostream *)&std::cout,ispring::xout[0x3c]);
    poVar2 = std::operator<<(poVar2,"Specify compiler name using -c <compiler>.");
    local_42 = ispring::xout[0x37];
    poVar2 = operator<<(poVar2,ispring::xout[0x37]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  local_43 = 0;
  get_default_compiler();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_128.compiler_name);
  CCDir::~CCDir(&local_128);
  bVar1 = std::operator==(__return_storage_ptr__,"");
  if (!bVar1) {
    poVar2 = operator<<((ostream *)&std::cout,ispring::xout[0x3e]);
    poVar2 = std::operator<<(poVar2,
                             "Compiler is not specified for installer. Use the default compiler.");
    poVar2 = operator<<(poVar2,ispring::xout[0x3a]);
    poVar2 = std::operator<<(poVar2,(string *)__return_storage_ptr__);
    poVar2 = operator<<(poVar2,ispring::xout[0x37]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return __return_storage_ptr__;
  }
  poVar2 = operator<<((ostream *)&std::cout,ispring::xout[0x3c]);
  poVar2 = std::operator<<(poVar2,"No compiler found.");
  poVar2 = operator<<(poVar2,ispring::xout[0x37]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

std::string get_compiler(bool allow_default=true){
        for(auto&e:args.options){
            if(e.first=="-c" || e.first=="--compiler"){
                return e.second;
            }
        }
        if(allow_default==false){
            std::cout << ispring::xout.light_red << "Specify compiler name using -c <compiler>." << ispring::xout.white << std::endl;
            exit(1);
        }
        std::string compiler_name=get_default_compiler().compiler_name;
        if(compiler_name==""){
            std::cout << ispring::xout.light_red << "No compiler found." << ispring::xout.white << std::endl;
            exit(1);
        }
        std::cout << ispring::xout.light_yellow << "Compiler is not specified for installer. Use the default compiler." << ispring::xout.light_green <<compiler_name << ispring::xout.white << std::endl;
        return compiler_name;
    }